

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QGridLayoutItem_*>::appendInitialize
          (QArrayDataPointer<QGridLayoutItem_*> *this,qsizetype newSize)

{
  QGridLayoutItem **ppQVar1;
  QGridLayoutItem *in_RSI;
  QGridLayoutItem **in_RDI;
  QGridLayoutItem **e;
  QGridLayoutItem **b;
  
  begin((QArrayDataPointer<QGridLayoutItem_*> *)0x8b94f0);
  ppQVar1 = begin((QArrayDataPointer<QGridLayoutItem_*> *)0x8b9509);
  std::uninitialized_value_construct<QGridLayoutItem**>(ppQVar1 + (long)in_RSI,in_RDI);
  in_RDI[2] = in_RSI;
  return;
}

Assistant:

void appendInitialize(qsizetype newSize)
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(!this->isShared());
        Q_ASSERT(newSize > this->size);
        Q_ASSERT(newSize - this->size <= this->freeSpaceAtEnd());

        T *const b = this->begin() + this->size;
        T *const e = this->begin() + newSize;
        q17::uninitialized_value_construct(b, e);
        this->size = newSize;
    }